

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Vfs_usleep(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  void *pvVar1;
  
  if ((0 < nArg) && (pObj = *apArg, (pObj->iFlags & 2) != 0)) {
    pvVar1 = pCtx->pFunc->pUserData;
    if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x50) == 0)) {
      jx9_context_throw_error_format
                (pCtx,2,"IO routine(%s) not implemented in the underlying VFS",
                 (pCtx->pFunc->sName).zString);
    }
    else {
      jx9MemObjToInteger(pObj);
      if (-1 < *(int *)&pObj->x) {
        (**(code **)((long)pvVar1 + 0x50))();
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Vfs_usleep(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_vfs *pVfs;
	int nSleep;
	if( nArg < 1 || !jx9_value_is_int(apArg[0]) ){
		/* Missing/Invalid argument, return immediately */
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xSleep == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS", 
			jx9_function_name(pCtx)
			);
		return JX9_OK;
	}
	/* Amount to sleep */
	nSleep = jx9_value_to_int(apArg[0]);
	if( nSleep < 0 ){
		/* Invalid value, return immediately */
		return JX9_OK;
	}
	/* Perform the requested operation (Microseconds) */
	pVfs->xSleep((unsigned int)nSleep);
	return JX9_OK;
}